

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void luaV_finishset(lua_State *L,TValue *t,TValue *key,TValue *val,int hres)

{
  Table *events;
  StkId pSVar1;
  Table *t_00;
  byte bVar2;
  TValue *f;
  int iVar3;
  bool bVar4;
  
  iVar3 = 2000;
  do {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) {
      luaG_runerror(L,"\'__newindex\' chain too long; possible loop");
    }
    if (hres == 2) {
      f = luaT_gettmbyobj(L,t,TM_NEWINDEX);
      bVar2 = f->tt_;
      if ((bVar2 & 0xf) == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    else {
      t_00 = (Table *)(t->value_).gc;
      events = t_00->metatable;
      if (((events == (Table *)0x0) || ((events->flags & 2) != 0)) ||
         (f = luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1]), f == (TValue *)0x0)) {
        pSVar1 = (L->top).p;
        *(Table **)pSVar1 = t_00;
        (pSVar1->val).tt_ = 'E';
        (L->top).p = (StkId)((L->top).offset + 0x10);
        luaH_finishset(L,t_00,key,val,hres);
        (L->top).p = (StkId)((L->top).offset + -0x10);
        t_00->flags = t_00->flags & 0xc0;
        if ((val->tt_ & 0x40) == 0) {
          return;
        }
        if ((t_00->marked & 0x20) == 0) {
          return;
        }
        bVar2 = ((val->value_).gc)->marked;
        goto joined_r0x0011bb06;
      }
      bVar2 = f->tt_;
    }
    if ((bVar2 & 0xf) == 6) {
      luaT_callTM(L,f,t,key,val);
      return;
    }
    hres = 2;
    t = f;
  } while ((bVar2 != 0x45) || (hres = luaH_pset((Table *)(f->value_).gc,key,val), hres != 0));
  if (((val->tt_ & 0x40) != 0) && (t_00 = (Table *)(f->value_).gc, (t_00->marked & 0x20) != 0)) {
    bVar2 = ((val->value_).gc)->marked;
joined_r0x0011bb06:
    if ((bVar2 & 0x18) != 0) {
      luaC_barrierback_(L,(GCObject *)t_00);
      return;
    }
  }
  return;
}

Assistant:

void luaV_finishset (lua_State *L, const TValue *t, TValue *key,
                      TValue *val, int hres) {
  int loop;  /* counter to avoid infinite loops */
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;  /* '__newindex' metamethod */
    if (hres != HNOTATABLE) {  /* is 't' a table? */
      Table *h = hvalue(t);  /* save 't' table */
      tm = fasttm(L, h->metatable, TM_NEWINDEX);  /* get metamethod */
      if (tm == NULL) {  /* no metamethod? */
        sethvalue2s(L, L->top.p, h);  /* anchor 't' */
        L->top.p++;  /* assume EXTRA_STACK */
        luaH_finishset(L, h, key, val, hres);  /* set new value */
        L->top.p--;
        invalidateTMcache(h);
        luaC_barrierback(L, obj2gco(h), val);
        return;
      }
      /* else will try the metamethod */
    }
    else {  /* not a table; check metamethod */
      tm = luaT_gettmbyobj(L, t, TM_NEWINDEX);
      if (l_unlikely(notm(tm)))
        luaG_typeerror(L, t, "index");
    }
    /* try the metamethod */
    if (ttisfunction(tm)) {
      luaT_callTM(L, tm, t, key, val);
      return;
    }
    t = tm;  /* else repeat assignment over 'tm' */
    luaV_fastset(t, key, val, hres, luaH_pset);
    if (hres == HOK) {
      luaV_finishfastset(L, t, val);
      return;  /* done */
    }
    /* else 'return luaV_finishset(L, t, key, val, slot)' (loop) */
  }
  luaG_runerror(L, "'__newindex' chain too long; possible loop");
}